

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void NodeEnumSingletonsEx(anynode *Any,array *List,nodemodule *Module)

{
  long lVar1;
  long *local_40;
  node **i;
  nodecontext *p;
  nodemodule *Module_local;
  array *List_local;
  anynode *Any_local;
  
  if (Any == (anynode *)0x0) {
    __assert_fail("(const void*)(Any)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x603,"void NodeEnumSingletonsEx(anynode *, array *, nodemodule *)");
  }
  lVar1 = **(long **)((long)Any + 8);
  List->_Begin = (char *)0x0;
  List->_Used = 0;
  if (lVar1 != -0x60) {
    local_40 = *(long **)(lVar1 + 0x60);
    while( true ) {
      if (lVar1 == -0x60) {
        __assert_fail("&(p->NodeSingleton)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x607,"void NodeEnumSingletonsEx(anynode *, array *, nodemodule *)");
      }
      if (local_40 ==
          (long *)(*(long *)(lVar1 + 0x60) + (*(ulong *)(lVar1 + 0x68) & 0xfffffffffffffff8)))
      break;
      if ((*local_40 != 0) &&
         ((Module == (nodemodule *)0x0 ||
          (*(nodemodule **)(*(long *)(*local_40 + 8) + -0x38) == Module)))) {
        ArrayAppend(List,local_40,8,0x40);
      }
      local_40 = local_40 + 1;
    }
    return;
  }
  __assert_fail("&(p->NodeSingleton)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0x607,"void NodeEnumSingletonsEx(anynode *, array *, nodemodule *)");
}

Assistant:

static NOINLINE void NodeEnumSingletonsEx(anynode* Any,array* List, nodemodule* Module)
{
    nodecontext* p = Node_Context(Any);
    node** i;
    ArrayInit(List);

    for (i=ARRAYBEGIN(p->NodeSingleton,node*);i!=ARRAYEND(p->NodeSingleton,node*);++i)
        if (*i && (!Module || NodeGetClass(*i)->Module == Module))
            ArrayAppend(List,i,sizeof(*i),64);
}